

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstrformat.cpp
# Opt level: O0

int myvsnprintf_helper(void *data,char *cstr,int cstr_len)

{
  snprintf_state *state;
  int cstr_len_local;
  char *cstr_local;
  void *data_local;
  
  if (0x7fffffff - cstr_len < *(int *)((long)data + 0x18)) {
    *(undefined4 *)((long)data + 0x18) = 0x7fffffff;
  }
  else {
    *(int *)((long)data + 0x18) = cstr_len + *(int *)((long)data + 0x18);
  }
  state._4_4_ = cstr_len;
  if (*(ulong *)((long)data + 8) < (ulong)(*(long *)((long)data + 0x10) + (long)cstr_len)) {
    state._4_4_ = (int)*(undefined8 *)((long)data + 8) - (int)*(undefined8 *)((long)data + 0x10);
  }
  if (0 < state._4_4_) {
    memcpy((void *)(*data + *(long *)((long)data + 0x10)),cstr,(long)state._4_4_);
    *(long *)((long)data + 0x10) = (long)state._4_4_ + *(long *)((long)data + 0x10);
  }
  return state._4_4_;
}

Assistant:

static int myvsnprintf_helper(void *data, const char *cstr, int cstr_len)
{
	snprintf_state *state = (snprintf_state *)data;

	if (INT_MAX - cstr_len < state->ideallen)
	{
		state->ideallen = INT_MAX;
	}
	else
	{
		state->ideallen += cstr_len;
	}
	if (state->curlen + cstr_len > state->maxlen)
	{
		cstr_len = (int)(state->maxlen - state->curlen);
	}
	if (cstr_len > 0)
	{
		memcpy(state->buffer + state->curlen, cstr, cstr_len);
		state->curlen += cstr_len;
	}
	return cstr_len;
}